

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_base_cancel_single_callback_(event_base *base,event_callback *evcb,int run_finalizers)

{
  uint uVar1;
  event *ev;
  int iVar2;
  
  if ((char)evcb->evcb_flags < '\0') {
    iVar2 = 0;
    if ((evcb->evcb_flags & 0x10U) == 0) {
      event_del_((event *)evcb,3);
      iVar2 = 1;
    }
  }
  else {
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    iVar2 = 1;
    event_callback_cancel_nolock_(base,evcb,1);
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
  }
  if ((run_finalizers != 0) && ((evcb->evcb_flags & 0x40U) != 0)) {
    uVar1 = evcb->evcb_closure - 5;
    if (uVar1 < 2) {
      if (-1 < (char)evcb->evcb_flags) {
        event_base_cancel_single_callback__cold_1();
      }
      (*(evcb->evcb_cb_union).evcb_callback)((int)evcb,(short)evcb->evcb_arg,(void *)(ulong)uVar1);
      if (evcb->evcb_closure == '\x06') {
        if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
          free(evcb);
        }
        else {
          (*mm_free_fn_)(evcb);
        }
      }
    }
    else if (evcb->evcb_closure == 4) {
      (*(evcb->evcb_cb_union).evcb_callback)((int)evcb,(short)evcb->evcb_arg,(void *)(ulong)uVar1);
    }
  }
  return iVar2;
}

Assistant:

static int
event_base_cancel_single_callback_(struct event_base *base,
    struct event_callback *evcb,
    int run_finalizers)
{
	int result = 0;

	if (evcb->evcb_flags & EVLIST_INIT) {
		struct event *ev = event_callback_to_event(evcb);
		if (!(ev->ev_flags & EVLIST_INTERNAL)) {
			event_del_(ev, EVENT_DEL_EVEN_IF_FINALIZING);
			result = 1;
		}
	} else {
		EVBASE_ACQUIRE_LOCK(base, th_base_lock);
		event_callback_cancel_nolock_(base, evcb, 1);
		EVBASE_RELEASE_LOCK(base, th_base_lock);
		result = 1;
	}

	if (run_finalizers && (evcb->evcb_flags & EVLIST_FINALIZING)) {
		switch (evcb->evcb_closure) {
		case EV_CLOSURE_EVENT_FINALIZE:
		case EV_CLOSURE_EVENT_FINALIZE_FREE: {
			struct event *ev = event_callback_to_event(evcb);
			ev->ev_evcallback.evcb_cb_union.evcb_evfinalize(ev, ev->ev_arg);
			if (evcb->evcb_closure == EV_CLOSURE_EVENT_FINALIZE_FREE)
				mm_free(ev);
			break;
		}
		case EV_CLOSURE_CB_FINALIZE:
			evcb->evcb_cb_union.evcb_cbfinalize(evcb, evcb->evcb_arg);
			break;
		default:
			break;
		}
	}
	return result;
}